

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O1

FT_Error sfnt_table_info(TT_Face face,FT_UInt idx,FT_ULong *tag,FT_ULong *offset,FT_ULong *length)

{
  TT_Table pTVar1;
  FT_Error FVar2;
  FT_ULong FVar3;
  
  FVar2 = 6;
  if (length != (FT_ULong *)0x0 && offset != (FT_ULong *)0x0) {
    FVar3 = (FT_ULong)face->num_tables;
    if (tag != (FT_ULong *)0x0) {
      if (face->num_tables <= idx) {
        return 0x8e;
      }
      pTVar1 = face->dir_tables;
      *tag = pTVar1[idx].Tag;
      *offset = pTVar1[idx].Offset;
      FVar3 = pTVar1[idx].Length;
    }
    *length = FVar3;
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

static FT_Error
  sfnt_table_info( TT_Face    face,
                   FT_UInt    idx,
                   FT_ULong  *tag,
                   FT_ULong  *offset,
                   FT_ULong  *length )
  {
    if ( !offset || !length )
      return FT_THROW( Invalid_Argument );

    if ( !tag )
      *length = face->num_tables;
    else
    {
      if ( idx >= face->num_tables )
        return FT_THROW( Table_Missing );

      *tag    = face->dir_tables[idx].Tag;
      *offset = face->dir_tables[idx].Offset;
      *length = face->dir_tables[idx].Length;
    }

    return FT_Err_Ok;
  }